

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int * generateProperInputVector(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randomVector)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *__ptr;
  long in_RCX;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  
  uVar12 = (ulong)c & 0xffffffff;
  iVar7 = (int)pNtk;
  __ptr = (int *)malloc((long)iVar7 * 4);
  if (0 < iVar7) {
    uVar1 = *(uint *)(in_RCX + 4);
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    do {
      iVar10 = (int)uVar12;
      if (uVar5 == uVar1) {
        if (__ptr != (int *)0x0) {
          free(__ptr);
        }
        return (int *)0x0;
      }
      if (uVar5 == uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = randomVector[1].pArray[iVar10];
      if (-1 < iVar2) {
        iVar8 = iVar2 + iVar10;
        if (iVar2 + iVar10 < iVar10) {
          iVar8 = iVar10;
        }
        lVar4 = *(long *)randomVector;
        iVar3 = *(int *)(*(long *)(in_RCX + 8) + uVar5 * 4);
        lVar9 = 0;
        do {
          __ptr[(long)*(int *)((long)iVar10 * 4 + lVar4 + lVar9 * 4) - (long)(int)c] = iVar3;
          lVar9 = lVar9 + 1;
        } while ((iVar8 - iVar10) + 1 != (int)lVar9);
      }
      uVar11 = iVar10 + iVar2 + 1;
      uVar12 = (ulong)uVar11;
      uVar5 = uVar5 + 1;
    } while ((int)uVar11 < iVar7 + (int)c);
  }
  return __ptr;
}

Assistant:

static int * 
generateProperInputVector( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randomVector )
{
    int * vPiValues;    
    int i, j, k, bit, input;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins =  Abc_NtkPiNum(pNtk);
    int n = numouts + numins;

    vPiValues = ABC_ALLOC( int,  numins);   

    for (i = numouts, k = 0; i < n; i += (c->clen[i]+1), k++) {
        if (k == Vec_IntSize(randomVector)) break;

        bit = Vec_IntEntry(randomVector, k);
        for (j = i; j <= (i + c->clen[i]); j++) {
            input = c->lab[j] - numouts;
            vPiValues[input] = bit;
        }
    }

    //if (k != Vec_IntSize(randomVector)) {
    if (i < n) {
        ABC_FREE( vPiValues );
        return NULL;
    }

    return vPiValues;
}